

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector(PlanningUnitMADPDiscrete *this)

{
  ulong uVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  long *in_RSI;
  PlanningUnitMADPDiscrete *in_RDI;
  Index agentI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts;
  value_type_conflict2 *in_stack_ffffffffffffff98;
  PlanningUnitMADPDiscrete *this_01;
  undefined4 local_18;
  
  this_01 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d569f);
  for (local_18 = 0; uVar1 = (**(code **)(*in_RSI + 0x30))(), local_18 < uVar1;
      local_18 = local_18 + 1) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              GetNrObservationHistories(this_01,(Index)((ulong)in_RDI >> 0x20));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_00,in_stack_ffffffffffffff98);
  }
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01;
}

Assistant:

const vector<size_t> PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector() const
{
    vector<size_t> nrOHts; 
    for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        nrOHts.push_back( GetNrObservationHistories(agentI) );
    return nrOHts;
}